

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

void xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,xmlParserNodeInfoPtr info)

{
  unsigned_long *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  xmlNodePtr node;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  _xmlNode *p_Var8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  uint uVar11;
  uint uVar12;
  unsigned_long i;
  unsigned_long uVar13;
  xmlParserNodeInfo *pxVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  
  if (info != (xmlParserNodeInfoPtr)0x0 && ctxt != (xmlParserCtxtPtr)0x0) {
    node = info->node;
    uVar13 = xmlParserFindNodeInfoIndex(&ctxt->node_seq,node);
    uVar15 = (ctxt->node_seq).length;
    if (((uVar13 < uVar15) &&
        (pxVar14 = (ctxt->node_seq).buffer, pxVar14 != (xmlParserNodeInfo *)0x0)) &&
       (pxVar14[uVar13].node == node)) {
      pxVar14 = pxVar14 + uVar13;
      pxVar14->end_line = info->end_line;
      p_Var8 = info->node;
      uVar13 = info->begin_pos;
      uVar9 = info->end_pos;
      pxVar14->begin_line = info->begin_line;
      pxVar14->end_pos = uVar9;
      pxVar14->node = p_Var8;
      pxVar14->begin_pos = uVar13;
    }
    else {
      uVar4 = (ctxt->node_seq).maximum;
      if (uVar4 < uVar15 + 1) {
        iVar16 = (int)uVar4;
        if (iVar16 < 1) {
          uVar12 = 4;
        }
        else {
          uVar12 = 0xffffffff;
          if ((iVar16 < 1000000000) &&
             (uVar11 = iVar16 + 1U >> 1, uVar12 = uVar11 + iVar16,
             (int)(1000000000 - uVar11) < iVar16)) {
            uVar12 = 1000000000;
          }
        }
        if ((int)uVar12 < 0) {
LAB_00146db1:
          xmlCtxtErrMemory(ctxt);
          return;
        }
        pxVar14 = (xmlParserNodeInfo *)(*xmlRealloc)((ctxt->node_seq).buffer,(ulong)uVar12 * 0x28);
        if (pxVar14 == (xmlParserNodeInfo *)0x0) goto LAB_00146db1;
        (ctxt->node_seq).buffer = pxVar14;
        (ctxt->node_seq).maximum = (ulong)uVar12;
      }
      uVar15 = (ctxt->node_seq).length;
      if (uVar13 < uVar15) {
        lVar17 = uVar15 * 0x28;
        do {
          pxVar14 = (ctxt->node_seq).buffer;
          *(undefined8 *)((long)&pxVar14->end_line + lVar17) =
               *(undefined8 *)((long)pxVar14 + lVar17 + -8);
          puVar2 = (undefined8 *)((long)&pxVar14[-1].node + lVar17);
          uVar5 = *puVar2;
          uVar6 = puVar2[1];
          puVar2 = (undefined8 *)((long)pxVar14 + lVar17 + -0x18);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pxVar14->begin_line + lVar17);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          puVar2 = (undefined8 *)((long)&pxVar14->node + lVar17);
          *puVar2 = uVar5;
          puVar2[1] = uVar6;
          uVar15 = uVar15 - 1;
          lVar17 = lVar17 + -0x28;
        } while (uVar13 < uVar15);
      }
      pxVar14 = (ctxt->node_seq).buffer;
      pxVar14[uVar13].end_line = info->end_line;
      p_Var8 = info->node;
      uVar9 = info->begin_pos;
      uVar10 = info->end_pos;
      pxVar14[uVar13].begin_line = info->begin_line;
      (&pxVar14[uVar13].begin_line)[1] = uVar10;
      pxVar14[uVar13].node = p_Var8;
      pxVar14[uVar13].begin_pos = uVar9;
      puVar1 = &(ctxt->node_seq).length;
      *puVar1 = *puVar1 + 1;
    }
  }
  return;
}

Assistant:

void
xmlParserAddNodeInfo(xmlParserCtxtPtr ctxt,
                     xmlParserNodeInfoPtr info)
{
    unsigned long pos;

    if ((ctxt == NULL) || (info == NULL)) return;

    /* Find pos and check to see if node is already in the sequence */
    pos = xmlParserFindNodeInfoIndex(&ctxt->node_seq, (xmlNodePtr)
                                     info->node);

    if ((pos < ctxt->node_seq.length) &&
        (ctxt->node_seq.buffer != NULL) &&
        (ctxt->node_seq.buffer[pos].node == info->node)) {
        ctxt->node_seq.buffer[pos] = *info;
    }

    /* Otherwise, we need to add new node to buffer */
    else {
        if (ctxt->node_seq.length + 1 > ctxt->node_seq.maximum) {
            xmlParserNodeInfo *tmp;
            int newSize;

            newSize = xmlGrowCapacity(ctxt->node_seq.maximum, sizeof(tmp[0]),
                                      4, XML_MAX_ITEMS);
            if (newSize < 0) {
		xmlCtxtErrMemory(ctxt);
                return;
            }
            tmp = xmlRealloc(ctxt->node_seq.buffer, newSize * sizeof(tmp[0]));
            if (tmp == NULL) {
		xmlCtxtErrMemory(ctxt);
                return;
            }
            ctxt->node_seq.buffer = tmp;
            ctxt->node_seq.maximum = newSize;
        }

        /* If position is not at end, move elements out of the way */
        if (pos != ctxt->node_seq.length) {
            unsigned long i;

            for (i = ctxt->node_seq.length; i > pos; i--)
                ctxt->node_seq.buffer[i] = ctxt->node_seq.buffer[i - 1];
        }

        /* Copy element and increase length */
        ctxt->node_seq.buffer[pos] = *info;
        ctxt->node_seq.length++;
    }
}